

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableModel::sort(QTableModel *this,int column,SortOrder order)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  iterator __first;
  iterator __last;
  int *piVar4;
  QTableWidgetItem *pQVar5;
  pointer ppQVar6;
  ulong uVar7;
  int iVar8;
  int c;
  int column_00;
  ulong uVar9;
  ulong uVar10;
  code *__comp;
  ulong uVar11;
  long in_FS_OFFSET;
  long local_108;
  undefined8 local_f8;
  QPersistentModelIndex *pQStack_f0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_e8;
  QArrayDataPointer<QModelIndex> local_d8;
  QArrayDataPointer<QModelIndex> local_b8;
  QTableWidgetItem *itm;
  QTableWidgetItem **ppQStack_90;
  undefined1 *puStack_88;
  QArrayDataPointer<int> local_78;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_78.size = 0;
  itm = (QTableWidgetItem *)0xffffffffffffffff;
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QTableWidgetItem_*,_int> *)0x0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (int *)0x0;
  ppQStack_90 = (QTableWidgetItem **)0x0;
  puStack_88 = (undefined1 *)0x0;
  uVar2 = (**(code **)(*(long *)this + 0x78))(this,&itm);
  QList<std::pair<QTableWidgetItem_*,_int>_>::reserve
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)&local_58,(long)(int)uVar2);
  QList<int>::reserve((QList<int> *)&local_78,(long)(int)uVar2);
  iVar8 = 0;
  while (local_b8.d = (Data *)CONCAT44(local_b8.d._4_4_,iVar8), iVar8 < (int)uVar2) {
    itm = item(this,iVar8,column);
    if (itm == (QTableWidgetItem *)0x0) {
      QList<int>::append((QList<int> *)&local_78,(parameter_type)local_b8.d);
    }
    else {
      QList<std::pair<QTableWidgetItem*,int>>::emplaceBack<QTableWidgetItem*&,int&>
                ((QList<std::pair<QTableWidgetItem*,int>> *)&local_58,&itm,(int *)&local_b8);
    }
    iVar8 = (parameter_type)local_b8.d + 1;
  }
  __comp = itemGreaterThan;
  if (order == AscendingOrder) {
    __comp = itemLessThan;
  }
  __first = QList<std::pair<QTableWidgetItem_*,_int>_>::begin
                      ((QList<std::pair<QTableWidgetItem_*,_int>_> *)&local_58);
  __last = QList<std::pair<QTableWidgetItem_*,_int>_>::end
                     ((QList<std::pair<QTableWidgetItem_*,_int>_> *)&local_58);
  std::
  __stable_sort<QList<std::pair<QTableWidgetItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>>
            (__first,__last,
             (_Iter_comp_iter<bool_(*)(const_std::pair<QTableWidgetItem_*,_int>_&,_const_std::pair<QTableWidgetItem_*,_int>_&)>
              )__comp);
  puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
  itm = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
  ppQStack_90 = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)&itm,(this->tableItems).d.size);
  local_b8.size = 0;
  local_d8.size = 0;
  local_f8 = (Data *)0xffffffffffffffff;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QModelIndex *)0x0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (QModelIndex *)0x0;
  pQStack_f0 = (QPersistentModelIndex *)0x0;
  tStack_e8.ptr = (QAbstractItemModel *)0x0;
  uVar3 = (**(code **)(*(long *)this + 0x80))(this);
  uVar7 = (ulong)uVar3;
  QList<QModelIndex>::reserve((QList<QModelIndex> *)&local_b8,(long)(int)(uVar3 * uVar2));
  QList<QModelIndex>::reserve((QList<QModelIndex> *)&local_d8,(long)(int)(uVar3 * uVar2));
  if ((int)uVar3 < 1) {
    uVar7 = 0;
  }
  local_108 = 0;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = 0;
  }
  for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
    piVar4 = &local_58.ptr[uVar11].second;
    if ((ulong)local_58.size <= uVar11) {
      piVar4 = local_78.ptr + (uVar11 - local_58.size);
    }
    iVar8 = *piVar4;
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      column_00 = (int)uVar10;
      pQVar5 = item(this,iVar8,column_00);
      lVar1 = (this->horizontalHeaderItems).d.size;
      ppQVar6 = QList<QTableWidgetItem_*>::data((QList<QTableWidgetItem_*> *)&itm);
      *(QTableWidgetItem **)((long)ppQVar6 + uVar10 * 8 + lVar1 * local_108) = pQVar5;
      local_f8 = (Data *)CONCAT44(column_00,iVar8);
      pQStack_f0 = (QPersistentModelIndex *)0x0;
      tStack_e8.ptr = (QAbstractItemModel *)this;
      QList<QModelIndex>::emplaceBack<QModelIndex>
                ((QList<QModelIndex> *)&local_b8,(QModelIndex *)&local_f8);
      local_f8 = (Data *)CONCAT44(column_00,(int)uVar11);
      pQStack_f0 = (QPersistentModelIndex *)0x0;
      tStack_e8.ptr = (QAbstractItemModel *)this;
      QList<QModelIndex>::emplaceBack<QModelIndex>
                ((QList<QModelIndex> *)&local_d8,(QModelIndex *)&local_f8);
    }
    local_108 = local_108 + 8;
  }
  local_f8 = (Data *)0x0;
  pQStack_f0 = (QPersistentModelIndex *)0x0;
  tStack_e8.ptr = (QAbstractItemModel *)0x0;
  QAbstractItemModel::layoutAboutToBeChanged
            ((QList_conflict *)this,
             (LayoutChangeHint)(QArrayDataPointer<QPersistentModelIndex> *)&local_f8);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_f8);
  QArrayDataPointer<QTableWidgetItem_*>::operator=
            (&(this->tableItems).d,(QArrayDataPointer<QTableWidgetItem_*> *)&itm);
  QAbstractItemModel::changePersistentIndexList((QList_conflict *)this,(QList_conflict *)&local_b8);
  local_f8 = (Data *)0x0;
  pQStack_f0 = (QPersistentModelIndex *)0x0;
  tStack_e8.ptr = (QAbstractItemModel *)0x0;
  QAbstractItemModel::layoutChanged
            ((QList_conflict *)this,
             (LayoutChangeHint)(QArrayDataPointer<QPersistentModelIndex> *)&local_f8);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_f8);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<QTableWidgetItem_*>::~QArrayDataPointer
            ((QArrayDataPointer<QTableWidgetItem_*> *)&itm);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::sort(int column, Qt::SortOrder order)
{
    QList<std::pair<QTableWidgetItem *, int>> sortable;
    QList<int> unsortable;
    const int numRows = rowCount();

    sortable.reserve(numRows);
    unsortable.reserve(numRows);

    for (int row = 0; row < numRows; ++row) {
        if (QTableWidgetItem *itm = item(row, column))
            sortable.emplace_back(itm, row);
        else
            unsortable.append(row);
    }

    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sortable.begin(), sortable.end(), compare);

    QList<QTableWidgetItem *> sorted_table(tableItems.size());
    QModelIndexList from;
    QModelIndexList to;
    const int numColumns = columnCount();
    from.reserve(numRows * numColumns);
    to.reserve(numRows * numColumns);
    for (int i = 0; i < numRows; ++i) {
        int r = (i < sortable.size()
                 ? sortable.at(i).second
                 : unsortable.at(i - sortable.size()));
        for (int c = 0; c < numColumns; ++c) {
            sorted_table[tableIndex(i, c)] = item(r, c);
            from.append(createIndex(r, c));
            to.append(createIndex(i, c));
        }
    }

    emit layoutAboutToBeChanged({}, QAbstractItemModel::VerticalSortHint);

    tableItems = sorted_table;
    changePersistentIndexList(from, to); // ### slow

    emit layoutChanged({}, QAbstractItemModel::VerticalSortHint);
}